

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jump_canonization.cpp
# Opt level: O2

shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
 __thiscall
IRT::canonizeJumps(IRT *this,
                  shared_ptr<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
                  *trees)

{
  CStatement *pCVar1;
  element_type *peVar2;
  CStatement *pCVar3;
  mapped_type *pmVar4;
  undefined8 extraout_RDX;
  _Rb_tree_node_base *p_Var5;
  undefined1 auVar6 [16];
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
  sVar7;
  vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  basicBlocks;
  vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  reorderedBlocks;
  
  basicBlocks.
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
  basicBlocks.
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[2]._M_t.
  super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>._M_t.
  super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>.
  super__Head_base<0UL,_IRT::CStatementList_*,_false>._M_head_impl = (CStatementList *)0x0;
  basicBlocks.
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[3]._M_t.
  super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>._M_t.
  super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>.
  super__Head_base<0UL,_IRT::CStatementList_*,_false>._M_head_impl = (CStatementList *)0x0;
  ((basicBlocks.
    super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
  super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>._M_t.
  super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>.
  super__Head_base<0UL,_IRT::CStatementList_*,_false>._M_head_impl = (CStatementList *)0x0;
  basicBlocks.
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
  super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>._M_t.
  super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>.
  super__Head_base<0UL,_IRT::CStatementList_*,_false>._M_head_impl = (CStatementList *)0x0;
  basicBlocks.
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[3]._M_t.
  super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>._M_t.
  super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>.
  super__Head_base<0UL,_IRT::CStatementList_*,_false>._M_head_impl =
       (CStatementList *)
       (basicBlocks.
        super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 1);
  basicBlocks.
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[4]._M_t.
  super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>._M_t.
  super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>.
  super__Head_base<0UL,_IRT::CStatementList_*,_false>._M_head_impl =
       (CStatementList *)
       (basicBlocks.
        super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 1);
  basicBlocks.
  super__Vector_base<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start[5]._M_t.
  super___uniq_ptr_impl<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>._M_t.
  super__Tuple_impl<0UL,_IRT::CStatementList_*,_std::default_delete<IRT::CStatementList>_>.
  super__Head_base<0UL,_IRT::CStatementList_*,_false>._M_head_impl = (CStatementList *)0x0;
  std::
  __shared_ptr<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>,std::default_delete<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>>,void>
            ((__shared_ptr<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>,(__gnu_cxx::_Lock_policy)2>
              *)this,(unique_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_std::default_delete<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>_>
                      *)&basicBlocks);
  std::
  unique_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_std::default_delete<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_std::default_delete<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>_>
                 *)&basicBlocks);
  peVar2 = (trees->
           super___shared_ptr<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  auVar6._8_8_ = extraout_RDX;
  auVar6._0_8_ = (peVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while (sVar7.
         super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi = auVar6._8_8_, p_Var5 = auVar6._0_8_,
        (_Rb_tree_header *)p_Var5 != &(peVar2->_M_t)._M_impl.super__Rb_tree_header) {
    divideTreeIntoBasicBlocks(&basicBlocks,*(CStatement **)(p_Var5 + 2));
    reorderByTracies(&reorderedBlocks,&basicBlocks);
    optimizeBlocks(&reorderedBlocks);
    pCVar3 = collectBlocksToTree(&reorderedBlocks);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
             ::operator[](*(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
                            **)this,(key_type *)(p_Var5 + 1));
    pCVar1 = (pmVar4->_M_t).
             super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
             .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    (pmVar4->_M_t).
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = pCVar3;
    if (pCVar1 != (CStatement *)0x0) {
      (**(code **)((long)(pCVar1->super_IStatement).super_INode + 0x10))();
    }
    std::
    vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
    ::~vector(&reorderedBlocks);
    std::
    vector<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>,_std::allocator<std::unique_ptr<IRT::CStatementList,_std::default_delete<IRT::CStatementList>_>_>_>
    ::~vector(&basicBlocks);
    auVar6 = std::_Rb_tree_increment(p_Var5);
    peVar2 = (trees->
             super___shared_ptr<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
  }
  sVar7.
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
          )sVar7.
           super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<MethodToIRTMap> canonizeJumps(std::shared_ptr<const MethodToIRTMap> trees) {
        std::shared_ptr<MethodToIRTMap> newTrees =
                std::shared_ptr<MethodToIRTMap>(std::move(std::unique_ptr<MethodToIRTMap>(new MethodToIRTMap())));
        for (auto tree = trees->begin(); tree != trees->end(); ++tree) {
            std::vector<std::unique_ptr<CStatementList>> basicBlocks =
                    divideTreeIntoBasicBlocks(tree->second.get());

            std::vector<std::unique_ptr<CStatementList>> reorderedBlocks =
                    reorderByTracies(basicBlocks);

            optimizeBlocks(reorderedBlocks);

            (*newTrees)[tree->first] = std::move(std::unique_ptr<const CStatement>(
                    collectBlocksToTree(reorderedBlocks)));
        }

        return newTrees;
    }